

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O0

const_iterator __thiscall
frozen::
set<std::basic_string_view<char,std::char_traits<char>>,5ul,std::less<std::basic_string_view<char,std::char_traits<char>>>>
::lower_bound<std::basic_string_view<char,std::char_traits<char>>>
          (set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  const_iterator pvVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> *unaff_retaddr;
  basic_string_view<char,_std::char_traits<char>_> *where;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff8;
  
  bits::carray<std::basic_string_view<char,_std::char_traits<char>_>,_5UL>::begin
            ((carray<std::basic_string_view<char,_std::char_traits<char>_>,_5UL> *)&in_RDI->_M_str);
  pbVar2 = bits::
           lower_bound<5ul,std::basic_string_view<char,std::char_traits<char>>const*,std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>>
                     (in_RDI,in_RSI,in_stack_ffffffffffffffe0);
  pbVar4 = pbVar2;
  pvVar3 = set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x65e89c);
  if ((pbVar2 == pvVar3) ||
     (bVar1 = CLI::std::less<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                        (unaff_retaddr,in_stack_fffffffffffffff8,in_RDI), bVar1)) {
    pbVar4 = set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_5UL,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)0x65e8d7);
  }
  return pbVar4;
}

Assistant:

constexpr const_iterator lower_bound(KeyType const &key) const {
    auto const where = bits::lower_bound<N>(keys_.begin(), key, less_than_);
    if ((where != end()) && !less_than_(key, *where))
      return where;
    else
      return end();
  }